

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O2

RK_S32 check_ref_cpb_pos(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  ulong uVar1;
  undefined8 in_RAX;
  char *fmt;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = frm->val;
  uVar2 = uVar1 >> 0x30;
  if (((uint)uVar1 & 0x41) == 1) {
    if ((char)uVar1 < '\0') {
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        if (((cpb->cpb_refs[lVar4 + 0x10].val & 1) != 0) &&
           ((((uint)cpb->cpb_refs[lVar4 + 0x10].val ^ (uint)uVar1) & 0xf00) == 0)) {
          uVar3 = lVar4 + 0x10;
          if (((byte)enc_refs_debug & 2) == 0) goto LAB_00123952;
          fmt = "found ltr ref %d at pos %d\n";
          goto LAB_0012393b;
        }
      }
    }
    else {
      for (uVar3 = 0; uVar3 != 0x10; uVar3 = uVar3 + 1) {
        if (((byte)enc_refs_debug & 2) != 0) {
          in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),
                            (uint)*(ushort *)((long)cpb->cpb_refs + uVar3 * 8 + 6));
          _mpp_log_l(4,"mpp_enc_refs","matching ref %d at pos %d %d\n","check_ref_cpb_pos",uVar2,
                     uVar3 & 0xffffffff,in_RAX);
        }
        if ((short)(cpb->cpb_refs[uVar3].val >> 0x30) == (short)(uVar1 >> 0x30) &&
            (cpb->cpb_refs[uVar3].val & 1) != 0) {
          if (((byte)enc_refs_debug & 2) != 0) {
            fmt = "found ref %d at pos %d\n";
LAB_0012393b:
            _mpp_log_l(4,"mpp_enc_refs",fmt,"check_ref_cpb_pos",uVar2,uVar3 & 0xffffffff);
          }
          goto LAB_00123952;
        }
      }
    }
    _mpp_log_l(2,"mpp_enc_refs","frm %d can NOT be found in st refs!!\n","check_ref_cpb_pos",uVar2);
    _dump_cpb(cpb,"check_ref_cpb_pos",0x1be);
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (((byte)enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","frm %d is not valid ref frm\n","check_ref_cpb_pos",uVar2);
    }
  }
LAB_00123952:
  return (RK_S32)uVar3;
}

Assistant:

static RK_S32 check_ref_cpb_pos(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 found = 0;
    RK_S32 pos = -1;

    if (!frm->valid || frm->is_non_ref) {
        enc_refs_dbg_flow("frm %d is not valid ref frm\n", seq_idx);
        return pos;
    }

    if (frm->is_lt_ref) {
        /* find same lt_idx */
        for (pos = 0; pos < MAX_CPB_LT_FRM; pos++) {
            RK_S32 cpb_idx = pos + MAX_CPB_ST_FRM;
            EncFrmStatus *cpb_ref = &cpb->cpb_refs[cpb_idx];

            if (cpb_ref->valid && cpb_ref->lt_idx == frm->lt_idx) {
                pos = cpb_idx;
                enc_refs_dbg_flow("found ltr ref %d at pos %d\n", seq_idx, pos);
                found = 1;
                break;
            }
        }
    } else {
        /* search seq_idx in cpb to check the st cpb size */
        for (pos = 0; pos < MAX_CPB_ST_FRM; pos++) {
            EncFrmStatus *cpb_ref = &cpb->cpb_refs[pos];

            enc_refs_dbg_flow("matching ref %d at pos %d %d\n",
                              seq_idx, pos, cpb_ref->seq_idx);

            if (cpb_ref->valid && cpb_ref->seq_idx == seq_idx) {
                enc_refs_dbg_flow("found ref %d at pos %d\n", seq_idx, pos);
                found = 1;
                break;
            }
        }
    }

    if (!found) {
        mpp_err_f("frm %d can NOT be found in st refs!!\n", seq_idx);
        pos = -1;
        dump_cpb(cpb);
    }

    return pos;
}